

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

string * __thiscall
smf::Binasc::keyToPitchName_abi_cxx11_(string *__return_storage_ptr__,Binasc *this,int key)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  stringstream output;
  allocator local_1c9;
  char *local_1c8;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  iVar3 = (int)this;
  iVar2 = iVar3 >> 0x1f;
  iVar1 = iVar3 / 0xc + iVar2;
  uVar4 = iVar3 + (iVar1 - iVar2) * -0xc;
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (uVar4 < 0xc) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,&DAT_00122f50 + *(int *)(&DAT_00122f50 + (ulong)uVar4 * 4),
               *(long *)(&DAT_00122f80 + (ulong)uVar4 * 8));
  }
  std::ostream::operator<<((ostream *)local_198,(iVar1 - iVar2) + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_1c8,&local_1c9);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Binasc::keyToPitchName(int key) {
	int pc = key % 12;
	int octave = key / 12 - 1;
	std::stringstream output;
	switch (pc) {
		case  0: output << "C";  break;
		case  1: output << "C#"; break;
		case  2: output << "D";  break;
		case  3: output << "D#"; break;
		case  4: output << "E";  break;
		case  5: output << "F";  break;
		case  6: output << "F#"; break;
		case  7: output << "G";  break;
		case  8: output << "G#"; break;
		case  9: output << "A";  break;
		case 10: output << "A#"; break;
		case 11: output << "B";  break;
	}
	output << octave;
	return output.str().c_str();
}